

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)10,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  char cVar7;
  Ea<(moira::Mode)5,_(moira::Size)2> dst;
  Ea<(moira::Mode)5,_(moira::Size)2> local_3c;
  
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])();
  local_3c.reg = op & 7;
  local_3c.pc = *addr;
  *addr = local_3c.pc + 2;
  local_3c.ext1 = (*this->_vptr_Moira[5])(this);
  local_3c.ext1 = local_3c.ext1 & 0xffff;
  bVar4 = str->upper;
  pcVar6 = "andi";
  if ((bool)bVar4 != false) {
    pcVar6 = "ANDI";
  }
  cVar7 = *pcVar6;
  if (cVar7 != '\0') {
    do {
      pcVar6 = pcVar6 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar7;
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
    bVar4 = str->upper;
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x57;
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  str->ptr = pcVar6 + 1;
  *pcVar6 = '#';
  StrWriter::operator<<(str,(UInt)(uVar5 & 0xffff));
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}